

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_naive_aggregator.cpp
# Opt level: O3

void __thiscall
duckdb::WindowNaiveState::Evaluate
          (WindowNaiveState *this,WindowAggregatorGlobalState *gsink,DataChunk *bounds,
          Vector *result,idx_t count,idx_t row_idx)

{
  unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true> *this_00;
  DataChunk *payload;
  WindowExcludeMode WVar1;
  data_ptr_t pdVar2;
  bool *pbVar3;
  sel_t *psVar4;
  idx_t iVar5;
  pointer pFVar6;
  aggregate_destructor_t p_Var7;
  idx_t iVar8;
  undefined8 uVar9;
  Vector *pVVar10;
  pointer pWVar11;
  const_reference pvVar12;
  reference pvVar13;
  ulong uVar14;
  reference pvVar15;
  pointer pCVar16;
  pointer pRVar17;
  FunctionDataWrapper *pFVar18;
  DataChunk *this_01;
  idx_t iVar19;
  ulong uVar20;
  ulong uVar21;
  size_type __n;
  unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true> *this_02;
  FrameBounds *frame;
  pointer pFVar22;
  ulong uVar23;
  FrameBounds *frame_1;
  pair<std::__detail::_Node_iterator<unsigned_long,_true,_true>,_bool> pVar24;
  unsigned_long f;
  SubFrames *__range3;
  EqualRow equal_row;
  HashRow hash_row;
  vector<duckdb::LogicalType,_true> types;
  RowSet row_set;
  LocalSortState local_sort;
  AggregateInputData aggr_input_data;
  ulong local_4f8;
  ulong local_4e8;
  SubFrames *local_4e0;
  SelectionVector *local_4d8;
  undefined1 local_4d0 [24];
  _Head_base<0UL,_duckdb::SBScanState_*,_false> local_4b8;
  __uniq_ptr_impl<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>_> local_4b0;
  _Head_base<0UL,_duckdb::SortedBlock_*,_false> local_4a8;
  _Tuple_impl<0UL,_duckdb::SortedBlock_*,_std::default_delete<duckdb::SortedBlock>_> local_4a0;
  vector<duckdb::vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>_>_>
  *local_490;
  data_ptr_t local_488;
  data_ptr_t local_480;
  Vector *local_478;
  data_ptr_t local_470;
  data_ptr_t local_468;
  RowLayout *local_460;
  AggregateFunction *local_458;
  data_ptr_t local_450;
  data_ptr_t local_448;
  data_ptr_t local_440;
  pointer local_438;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_duckdb::WindowNaiveState::EqualRow,_duckdb::WindowNaiveState::HashRow,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_430;
  key_equal local_428;
  HashRow local_420;
  vector<duckdb::LogicalType,_true> local_418;
  undefined1 local_400 [280];
  undefined1 local_2e8 [504];
  pointer local_f0;
  vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
  local_c8;
  vector<duckdb::vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>_>_>
  vStack_b0;
  __uniq_ptr_impl<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>_> local_98;
  vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
  local_90;
  vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_> local_78 [3];
  
  this_02 = &(this->super_WindowAggregatorLocalState).cursor;
  pWVar11 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::
            operator->(this_02);
  DataChunk::GetTypes(&local_418,&pWVar11->chunk);
  local_450 = (this->statef).data;
  local_488 = (this->statep).data;
  local_428.state = this;
  local_420.state = this;
  ::std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_duckdb::WindowNaiveState::EqualRow,_duckdb::WindowNaiveState::HashRow,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_duckdb::WindowNaiveState::EqualRow,_duckdb::WindowNaiveState::HashRow,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)local_400,0x800,&local_420,&local_428,(allocator_type *)local_2e8);
  WVar1 = (this->aggregator->super_WindowAggregator).exclude_mode;
  local_478 = result;
  pvVar12 = vector<duckdb::Vector,_true>::operator[](&bounds->data,6);
  local_440 = pvVar12->data;
  pvVar12 = vector<duckdb::Vector,_true>::operator[](&bounds->data,7);
  local_448 = pvVar12->data;
  pvVar12 = vector<duckdb::Vector,_true>::operator[](&bounds->data,2);
  local_470 = pvVar12->data;
  pvVar12 = vector<duckdb::Vector,_true>::operator[](&bounds->data,3);
  if (count != 0) {
    local_458 = &(gsink->aggr).function;
    local_4e0 = &this->frames;
    local_468 = pvVar12->data;
    local_490 = &vStack_b0;
    this_01 = &this->orderby_sort;
    this_00 = &this->arg_orderer;
    local_460 = &this->payload_layout;
    payload = &this->orderby_payload;
    local_4d8 = &this->orderby_sel;
    iVar19 = 0;
    local_4f8 = row_idx;
    do {
      uVar23 = *(ulong *)(local_440 + iVar19 * 8);
      uVar21 = *(ulong *)(local_448 + iVar19 * 8);
      if (WVar1 == NO_OTHER) {
        __n = 0;
      }
      else {
        uVar14 = local_4f8;
        if (WVar1 != CURRENT_ROW) {
          uVar14 = *(ulong *)(local_470 + iVar19 * 8);
        }
        pvVar13 = vector<duckdb::FrameBounds,_true>::operator[](local_4e0,0);
        if (uVar21 <= uVar14) {
          uVar14 = uVar21;
        }
        if (uVar14 <= uVar23) {
          uVar14 = uVar23;
        }
        pvVar13->start = uVar23;
        pvVar13->end = uVar14;
        if (WVar1 == TIES) {
          pvVar13 = vector<duckdb::FrameBounds,_true>::operator[](local_4e0,1);
          uVar14 = local_4f8 + 1;
          if (uVar21 <= local_4f8 + 1) {
            uVar14 = uVar21;
          }
          if (uVar14 <= uVar23) {
            uVar14 = uVar23;
          }
          uVar20 = uVar23;
          if (uVar23 < local_4f8) {
            uVar20 = local_4f8;
          }
          if (uVar21 <= uVar20) {
            uVar20 = uVar21;
          }
          pvVar13->start = uVar20;
          pvVar13->end = uVar14;
          __n = 2;
LAB_0119da70:
          uVar14 = *(ulong *)(local_468 + iVar19 * 8);
        }
        else {
          __n = 1;
          if (WVar1 != CURRENT_ROW) goto LAB_0119da70;
          uVar14 = local_4f8 + 1;
        }
        if (uVar23 < uVar14) {
          uVar23 = uVar14;
        }
        if (uVar21 <= uVar23) {
          uVar23 = uVar21;
        }
      }
      pvVar13 = vector<duckdb::FrameBounds,_true>::operator[](local_4e0,__n);
      pvVar13->start = uVar23;
      pvVar13->end = uVar21;
      local_480 = *(data_ptr_t *)(local_450 + iVar19 * 8);
      (*(gsink->aggr).function.initialize)(local_458,local_480);
      ::std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_duckdb::WindowNaiveState::EqualRow,_duckdb::WindowNaiveState::HashRow,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::clear((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_duckdb::WindowNaiveState::EqualRow,_duckdb::WindowNaiveState::HashRow,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               *)local_400);
      if ((this_00->
          super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>)._M_t.
          super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>
          .super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl == (WindowCursor *)0x0)
      {
        pFVar6 = (this->frames).
                 super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
                 super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        for (pFVar22 = (this->frames).
                       super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
                       super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                       ._M_impl.super__Vector_impl_data._M_start; pFVar22 != pFVar6;
            pFVar22 = pFVar22 + 1) {
          for (local_400._72_8_ = pFVar22->start; (ulong)local_400._72_8_ < pFVar22->end;
              local_400._72_8_ = local_400._72_8_ + 1) {
            pbVar3 = (gsink->filter_mask).validity_mask;
            if ((pbVar3 == (bool *)0x0) || (pbVar3[local_400._72_8_] == true)) {
              pWVar11 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                        ::operator->(this_02);
              if (((pWVar11->state).next_row_index <= (ulong)local_400._72_8_) ||
                 ((ulong)local_400._72_8_ < (pWVar11->state).current_row_index)) {
                FlushStates(this,gsink);
                pWVar11 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                          ::operator->(this_02);
                uVar9 = local_400._72_8_;
                if (((pWVar11->state).next_row_index <= (ulong)local_400._72_8_) ||
                   ((ulong)local_400._72_8_ < (pWVar11->state).current_row_index)) {
                  pCVar16 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                            ::operator->(&pWVar11->paged->inputs);
                  ColumnDataCollection::Seek(pCVar16,uVar9,&pWVar11->state,&pWVar11->chunk);
                }
              }
              if ((gsink->aggr).aggr_type == DISTINCT) {
                local_2e8._0_8_ = local_400;
                pVar24 = ::std::
                         _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,duckdb::WindowNaiveState::EqualRow,duckdb::WindowNaiveState::HashRow,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                         ::
                         _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,true>>>>
                                   ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,duckdb::WindowNaiveState::EqualRow,duckdb::WindowNaiveState::HashRow,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                     *)local_2e8._0_8_,local_400 + 0x48,local_2e8);
                if (((undefined1  [16])pVar24 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                goto LAB_0119e1f2;
              }
              *(data_ptr_t *)(local_488 + this->flush_count * 8) = local_480;
              pWVar11 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                        ::operator->(this_02);
              iVar8 = (pWVar11->state).current_row_index;
              psVar4 = (this->update_sel).sel_vector;
              iVar5 = this->flush_count;
              uVar23 = iVar5 + 1;
              this->flush_count = uVar23;
              psVar4[iVar5] = local_400._72_4_ - (int)iVar8;
              if (0x7ff < uVar23) {
                FlushStates(this,gsink);
              }
            }
LAB_0119e1f2:
          }
        }
      }
      else {
        GlobalSortState::GlobalSortState
                  ((GlobalSortState *)local_2e8,
                   (this->aggregator->executor->super_WindowExecutor).context,
                   &((this->aggregator->super_WindowAggregator).wexpr)->arg_orders,local_460);
        LocalSortState::LocalSortState((LocalSortState *)(local_400 + 0x48));
        LocalSortState::Initialize
                  ((LocalSortState *)(local_400 + 0x48),(GlobalSortState *)local_2e8,
                   (BufferManager *)local_2e8._48_8_);
        pvVar15 = vector<duckdb::Vector,_true>::operator[](&payload->data,0);
        pFVar22 = (this->frames).
                  super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
                  super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        local_438 = (this->frames).
                    super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
                    super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        if (pFVar22 != local_438) {
          pdVar2 = pvVar15->data;
          uVar23 = 0;
          do {
            uVar14 = pFVar22->end;
            for (uVar21 = pFVar22->start; uVar21 < uVar14; uVar21 = uVar21 + 1) {
              pbVar3 = (gsink->filter_mask).validity_mask;
              if ((pbVar3 == (bool *)0x0) || (pbVar3[uVar21] == true)) {
                pWVar11 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                          ::operator->(this_00);
                if ((uVar21 < (pWVar11->state).current_row_index ||
                    (pWVar11->state).next_row_index <= uVar21) || 0x7ff < uVar23) {
                  if (uVar23 != 0) {
                    pWVar11 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                              ::operator->(this_00);
                    DataChunk::Reference(this_01,&pWVar11->chunk);
                    DataChunk::Slice(this_01,local_4d8,uVar23);
                    (this->orderby_payload).count = uVar23;
                    LocalSortState::SinkChunk((LocalSortState *)(local_400 + 0x48),this_01,payload);
                  }
                  pWVar11 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                            ::operator->(this_00);
                  if (((pWVar11->state).next_row_index <= uVar21) ||
                     (uVar21 < (pWVar11->state).current_row_index)) {
                    pCVar16 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                              ::operator->(&pWVar11->paged->inputs);
                    ColumnDataCollection::Seek(pCVar16,uVar21,&pWVar11->state,&pWVar11->chunk);
                  }
                  uVar23 = 0;
                }
                *(ulong *)(pdVar2 + uVar23 * 8) = uVar21;
                pWVar11 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                          ::operator->(this_00);
                local_4d8->sel_vector[uVar23] =
                     (int)uVar21 - (int)(pWVar11->state).current_row_index;
                uVar23 = uVar23 + 1;
                uVar14 = pFVar22->end;
              }
            }
            pFVar22 = pFVar22 + 1;
          } while (pFVar22 != local_438);
          if (uVar23 != 0) {
            pWVar11 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                      ::operator->(this_00);
            DataChunk::Reference(this_01,&pWVar11->chunk);
            DataChunk::Slice(this_01,local_4d8,uVar23);
            (this->orderby_payload).count = uVar23;
            LocalSortState::SinkChunk((LocalSortState *)(local_400 + 0x48),this_01,payload);
          }
        }
        GlobalSortState::AddLocalState
                  ((GlobalSortState *)local_2e8,(LocalSortState *)(local_400 + 0x48));
        if (local_c8.
            super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_c8.
            super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          GlobalSortState::PrepareMergePhase((GlobalSortState *)local_2e8);
          uVar23 = (long)local_c8.
                         super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_c8.
                         super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          while (8 < uVar23) {
            GlobalSortState::InitializeMergeRound((GlobalSortState *)local_2e8);
            MergeSorter::MergeSorter
                      ((MergeSorter *)local_4d0,(GlobalSortState *)local_2e8,
                       (BufferManager *)local_2e8._48_8_);
            MergeSorter::PerformInMergeRound((MergeSorter *)local_4d0);
            GlobalSortState::CompleteMergeRound((GlobalSortState *)local_2e8,false);
            if (local_4a0.super__Head_base<0UL,_duckdb::SortedBlock_*,_false>._M_head_impl !=
                (SortedBlock *)0x0) {
              ::std::default_delete<duckdb::SortedBlock>::operator()
                        ((default_delete<duckdb::SortedBlock> *)&local_4a0,
                         (SortedBlock *)
                         local_4a0.super__Head_base<0UL,_duckdb::SortedBlock_*,_false>._M_head_impl)
              ;
            }
            local_4a0.super__Head_base<0UL,_duckdb::SortedBlock_*,_false>._M_head_impl =
                 (_Head_base<0UL,_duckdb::SortedBlock_*,_false>)(SortedBlock *)0x0;
            if (local_4a8._M_head_impl != (SortedBlock *)0x0) {
              ::std::default_delete<duckdb::SortedBlock>::operator()
                        ((default_delete<duckdb::SortedBlock> *)&local_4a8,local_4a8._M_head_impl);
            }
            local_4a8._M_head_impl = (SortedBlock *)0x0;
            if ((_Tuple_impl<0UL,_duckdb::SBScanState_*,_std::default_delete<duckdb::SBScanState>_>)
                local_4b0._M_t.
                super__Tuple_impl<0UL,_duckdb::SBScanState_*,_std::default_delete<duckdb::SBScanState>_>
                .super__Head_base<0UL,_duckdb::SBScanState_*,_false>._M_head_impl !=
                (SBScanState *)0x0) {
              ::std::default_delete<duckdb::SBScanState>::operator()
                        ((default_delete<duckdb::SBScanState> *)&local_4b0,
                         (SBScanState *)
                         local_4b0._M_t.
                         super__Tuple_impl<0UL,_duckdb::SBScanState_*,_std::default_delete<duckdb::SBScanState>_>
                         .super__Head_base<0UL,_duckdb::SBScanState_*,_false>._M_head_impl);
            }
            local_4b0._M_t.
            super__Tuple_impl<0UL,_duckdb::SBScanState_*,_std::default_delete<duckdb::SBScanState>_>
            .super__Head_base<0UL,_duckdb::SBScanState_*,_false>._M_head_impl =
                 (tuple<duckdb::SBScanState_*,_std::default_delete<duckdb::SBScanState>_>)
                 (_Tuple_impl<0UL,_duckdb::SBScanState_*,_std::default_delete<duckdb::SBScanState>_>
                 )0x0;
            if ((_Tuple_impl<0UL,_duckdb::SBScanState_*,_std::default_delete<duckdb::SBScanState>_>)
                local_4b8._M_head_impl != (SBScanState *)0x0) {
              ::std::default_delete<duckdb::SBScanState>::operator()
                        ((default_delete<duckdb::SBScanState> *)&local_4b8,local_4b8._M_head_impl);
            }
            uVar23 = (long)local_c8.
                           super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_c8.
                           super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
          }
          PayloadScanner::PayloadScanner
                    ((PayloadScanner *)local_4d0,(GlobalSortState *)local_2e8,true);
          while (pRVar17 = unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>,_true>
                           ::operator->((unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>,_true>
                                         *)(local_4d0 + 0x10)), uVar9 = local_4d0._16_8_,
                pRVar17->total_count != pRVar17->total_scanned) {
            DataChunk::Reset(payload);
            PayloadScanner::Scan((PayloadScanner *)local_4d0,payload);
            pvVar15 = vector<duckdb::Vector,_true>::operator[](&payload->data,0);
            if ((this->orderby_payload).count != 0) {
              pdVar2 = pvVar15->data;
              uVar23 = 0;
              do {
                local_4e8 = *(ulong *)(pdVar2 + uVar23 * 8);
                pWVar11 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                          ::operator->(this_02);
                if (((pWVar11->state).next_row_index <= local_4e8) ||
                   (local_4e8 < (pWVar11->state).current_row_index)) {
                  FlushStates(this,gsink);
                  pWVar11 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                            ::operator->(this_02);
                  uVar21 = local_4e8;
                  if (((pWVar11->state).next_row_index <= local_4e8) ||
                     (local_4e8 < (pWVar11->state).current_row_index)) {
                    pCVar16 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                              ::operator->(&pWVar11->paged->inputs);
                    ColumnDataCollection::Seek(pCVar16,uVar21,&pWVar11->state,&pWVar11->chunk);
                  }
                }
                if ((gsink->aggr).aggr_type == DISTINCT) {
                  local_430 = (_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_duckdb::WindowNaiveState::EqualRow,_duckdb::WindowNaiveState::HashRow,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                               *)local_400;
                  pVar24 = ::std::
                           _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,duckdb::WindowNaiveState::EqualRow,duckdb::WindowNaiveState::HashRow,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                           ::
                           _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,true>>>>
                                     ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,duckdb::WindowNaiveState::EqualRow,duckdb::WindowNaiveState::HashRow,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                       *)local_430,&local_4e8,&local_430);
                  if (((undefined1  [16])pVar24 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                  goto LAB_0119df15;
                }
                else {
LAB_0119df15:
                  *(data_ptr_t *)(local_488 + this->flush_count * 8) = local_480;
                  pWVar11 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                            ::operator->(this_02);
                  iVar8 = (pWVar11->state).current_row_index;
                  psVar4 = (this->update_sel).sel_vector;
                  iVar5 = this->flush_count;
                  uVar21 = iVar5 + 1;
                  this->flush_count = uVar21;
                  psVar4[iVar5] = (int)local_4e8 - (int)iVar8;
                  if (0x7ff < uVar21) {
                    FlushStates(this,gsink);
                  }
                }
                uVar23 = uVar23 + 1;
              } while (uVar23 < (this->orderby_payload).count);
            }
          }
          if ((SortLayout *)local_4d0._16_8_ != (SortLayout *)0x0) {
            RowDataCollectionScanner::~RowDataCollectionScanner
                      ((RowDataCollectionScanner *)local_4d0._16_8_);
            operator_delete((void *)uVar9);
          }
          uVar9 = local_4d0._8_8_;
          local_4d0._16_8_ =
               (tuple<duckdb::RowDataCollectionScanner_*,_std::default_delete<duckdb::RowDataCollectionScanner>_>
                )0x0;
          if ((RowDataCollection *)local_4d0._8_8_ != (RowDataCollection *)0x0) {
            ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::~vector
                      ((vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_> *)
                       (local_4d0._8_8_ + 0x38));
            ::std::
            vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
            ::~vector((vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                       *)(uVar9 + 0x20));
            operator_delete((void *)uVar9);
          }
          uVar9 = local_4d0._0_8_;
          local_4d0._8_8_ = (RowDataCollection *)0x0;
          if ((GlobalSortState *)local_4d0._0_8_ != (GlobalSortState *)0x0) {
            ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::~vector
                      ((vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_> *)
                       (local_4d0._0_8_ + 0x38));
            ::std::
            vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
            ::~vector((vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                       *)(uVar9 + 0x20));
            operator_delete((void *)uVar9);
          }
        }
        LocalSortState::~LocalSortState((LocalSortState *)(local_400 + 0x48));
        ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::~vector
                  (local_78);
        ::std::
        vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
        ::~vector(&local_90);
        if ((_Tuple_impl<0UL,_duckdb::SortedBlock_*,_std::default_delete<duckdb::SortedBlock>_>)
            local_98._M_t.
            super__Tuple_impl<0UL,_duckdb::SortedBlock_*,_std::default_delete<duckdb::SortedBlock>_>
            .super__Head_base<0UL,_duckdb::SortedBlock_*,_false>._M_head_impl != (SortedBlock *)0x0)
        {
          ::std::default_delete<duckdb::SortedBlock>::operator()
                    ((default_delete<duckdb::SortedBlock> *)&local_98,
                     (SortedBlock *)
                     local_98._M_t.
                     super__Tuple_impl<0UL,_duckdb::SortedBlock_*,_std::default_delete<duckdb::SortedBlock>_>
                     .super__Head_base<0UL,_duckdb::SortedBlock_*,_false>._M_head_impl);
        }
        local_98._M_t.
        super__Tuple_impl<0UL,_duckdb::SortedBlock_*,_std::default_delete<duckdb::SortedBlock>_>.
        super__Head_base<0UL,_duckdb::SortedBlock_*,_false>._M_head_impl =
             (tuple<duckdb::SortedBlock_*,_std::default_delete<duckdb::SortedBlock>_>)0x0;
        ::std::
        vector<duckdb::vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>_>_>
        ::~vector(local_490);
        ::std::
        vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
        ::~vector(&local_c8);
        if (local_f0 != (pointer)0x0) {
          operator_delete(local_f0);
        }
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                   (local_2e8 + 0x1c8));
        SortLayout::~SortLayout((SortLayout *)(local_2e8 + 0x38));
      }
      iVar19 = iVar19 + 1;
      local_4f8 = local_4f8 + 1;
    } while (iVar19 != count);
  }
  FlushStates(this,gsink);
  pVVar10 = local_478;
  if ((gsink->aggr).bind_data_wrapper.internal.
      super___shared_ptr<duckdb::FunctionDataWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    local_2e8._0_8_ = (FunctionData *)0x0;
  }
  else {
    pFVar18 = shared_ptr<duckdb::FunctionDataWrapper,_true>::operator->
                        (&(gsink->aggr).bind_data_wrapper);
    local_2e8._0_8_ =
         (pFVar18->function_data).
         super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
         super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>;
  }
  local_2e8._8_8_ = &(this->super_WindowAggregatorLocalState).super_WindowAggregatorState.allocator;
  local_2e8[0x10] = '\x01';
  (*(gsink->aggr).function.finalize)(&this->statef,(AggregateInputData *)local_2e8,pVVar10,count,0);
  p_Var7 = (gsink->aggr).function.destructor;
  if (p_Var7 != (aggregate_destructor_t)0x0) {
    (*p_Var7)(&this->statef,(AggregateInputData *)local_2e8,count);
  }
  ::std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_duckdb::WindowNaiveState::EqualRow,_duckdb::WindowNaiveState::HashRow,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_duckdb::WindowNaiveState::EqualRow,_duckdb::WindowNaiveState::HashRow,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_400);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_418);
  return;
}

Assistant:

void WindowNaiveState::Evaluate(const WindowAggregatorGlobalState &gsink, const DataChunk &bounds, Vector &result,
                                idx_t count, idx_t row_idx) {
	const auto &aggr = gsink.aggr;
	auto &filter_mask = gsink.filter_mask;
	const auto types = cursor->chunk.GetTypes();

	auto fdata = FlatVector::GetData<data_ptr_t>(statef);
	auto pdata = FlatVector::GetData<data_ptr_t>(statep);

	HashRow hash_row(*this);
	EqualRow equal_row(*this);
	RowSet row_set(STANDARD_VECTOR_SIZE, hash_row, equal_row);

	WindowAggregator::EvaluateSubFrames(bounds, aggregator.exclude_mode, count, row_idx, frames, [&](idx_t rid) {
		auto agg_state = fdata[rid];
		aggr.function.initialize(aggr.function, agg_state);

		//	Reset the DISTINCT hash table
		row_set.clear();

		// 	Sort the input rows by the argument
		if (arg_orderer) {
			auto &context = aggregator.executor.context;
			auto &orders = aggregator.wexpr.arg_orders;
			GlobalSortState global_sort(context, orders, payload_layout);
			LocalSortState local_sort;
			local_sort.Initialize(global_sort, global_sort.buffer_manager);

			idx_t orderby_count = 0;
			auto orderby_row = FlatVector::GetData<idx_t>(orderby_payload.data[0]);
			for (const auto &frame : frames) {
				for (auto f = frame.start; f < frame.end; ++f) {
					//	FILTER before the ORDER BY
					if (!filter_mask.RowIsValid(f)) {
						continue;
					}

					if (!arg_orderer->RowIsVisible(f) || orderby_count >= STANDARD_VECTOR_SIZE) {
						if (orderby_count) {
							orderby_sort.Reference(arg_orderer->chunk);
							orderby_sort.Slice(orderby_sel, orderby_count);
							orderby_payload.SetCardinality(orderby_count);
							local_sort.SinkChunk(orderby_sort, orderby_payload);
						}
						orderby_count = 0;
						arg_orderer->Seek(f);
					}
					orderby_row[orderby_count] = f;
					orderby_sel.set_index(orderby_count++, arg_orderer->RowOffset(f));
				}
			}
			if (orderby_count) {
				orderby_sort.Reference(arg_orderer->chunk);
				orderby_sort.Slice(orderby_sel, orderby_count);
				orderby_payload.SetCardinality(orderby_count);
				local_sort.SinkChunk(orderby_sort, orderby_payload);
			}

			global_sort.AddLocalState(local_sort);
			if (global_sort.sorted_blocks.empty()) {
				return;
			}
			global_sort.PrepareMergePhase();
			while (global_sort.sorted_blocks.size() > 1) {
				global_sort.InitializeMergeRound();
				MergeSorter merge_sorter(global_sort, global_sort.buffer_manager);
				merge_sorter.PerformInMergeRound();
				global_sort.CompleteMergeRound(false);
			}

			PayloadScanner scanner(global_sort);
			while (scanner.Remaining()) {
				orderby_payload.Reset();
				scanner.Scan(orderby_payload);
				orderby_row = FlatVector::GetData<idx_t>(orderby_payload.data[0]);
				for (idx_t i = 0; i < orderby_payload.size(); ++i) {
					const auto f = orderby_row[i];
					//	Seek to the current position
					if (!cursor->RowIsVisible(f)) {
						//	We need to flush when we cross a chunk boundary
						FlushStates(gsink);
						cursor->Seek(f);
					}

					//	Filter out duplicates
					if (aggr.IsDistinct() && !row_set.insert(f).second) {
						continue;
					}

					pdata[flush_count] = agg_state;
					update_sel[flush_count++] = cursor->RowOffset(f);
					if (flush_count >= STANDARD_VECTOR_SIZE) {
						FlushStates(gsink);
					}
				}
			}
			return;
		}

		//	Just update the aggregate with the unfiltered input rows
		for (const auto &frame : frames) {
			for (auto f = frame.start; f < frame.end; ++f) {
				if (!filter_mask.RowIsValid(f)) {
					continue;
				}

				//	Seek to the current position
				if (!cursor->RowIsVisible(f)) {
					//	We need to flush when we cross a chunk boundary
					FlushStates(gsink);
					cursor->Seek(f);
				}

				//	Filter out duplicates
				if (aggr.IsDistinct() && !row_set.insert(f).second) {
					continue;
				}

				pdata[flush_count] = agg_state;
				update_sel[flush_count++] = cursor->RowOffset(f);
				if (flush_count >= STANDARD_VECTOR_SIZE) {
					FlushStates(gsink);
				}
			}
		}
	});

	//	Flush the final states
	FlushStates(gsink);

	//	Finalise the result aggregates and write to the result
	AggregateInputData aggr_input_data(aggr.GetFunctionData(), allocator);
	aggr.function.finalize(statef, aggr_input_data, result, count, 0);

	//	Destruct the result aggregates
	if (aggr.function.destructor) {
		aggr.function.destructor(statef, aggr_input_data, count);
	}
}